

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

int __thiscall cppcms::http::details::async_io_buf::overflow(async_io_buf *this,int c)

{
  vector<char,_std::allocator<char>_> *this_00;
  vector<char,_std::allocator<char>_> *pvVar1;
  size_type sVar2;
  reference pvVar3;
  undefined1 *puVar4;
  int in_ESI;
  async_io_buf *in_RDI;
  size_t current_size;
  int in_stack_000000b4;
  basic_device *in_stack_000000b8;
  size_type in_stack_ffffffffffffffc8;
  int local_4;
  
  if ((in_RDI->full_buffering_ & 1U) == 0) {
    local_4 = basic_device::overflow(in_stack_000000b8,in_stack_000000b4);
  }
  else {
    this_00 = (vector<char,_std::allocator<char>_> *)std::streambuf::pptr();
    pvVar1 = (vector<char,_std::allocator<char>_> *)std::streambuf::epptr();
    if (this_00 == pvVar1) {
      std::streambuf::pptr();
      std::streambuf::pbase();
      sVar2 = std::vector<char,_std::allocator<char>_>::size(&(in_RDI->super_basic_device).output_);
      next_size(in_RDI,sVar2);
      std::vector<char,_std::allocator<char>_>::resize(this_00,in_stack_ffffffffffffffc8);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&(in_RDI->super_basic_device).output_,0);
      sVar2 = std::vector<char,_std::allocator<char>_>::size(&(in_RDI->super_basic_device).output_);
      std::vector<char,_std::allocator<char>_>::operator[]
                (&(in_RDI->super_basic_device).output_,sVar2 - 1);
      std::streambuf::setp((char *)in_RDI,pvVar3);
      std::streambuf::pbump((int)in_RDI);
    }
    if (in_ESI != -1) {
      puVar4 = (undefined1 *)std::streambuf::pptr();
      *puVar4 = (char)in_ESI;
      std::streambuf::pbump((int)in_RDI);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

virtual int overflow(int c)
		{
			if(full_buffering_) {
				if(pptr() ==  epptr()) {
					size_t current_size = pptr() - pbase();
					output_.resize(next_size(output_.size()));
					setp(&output_[0],&output_[output_.size()-1]+1);
					pbump(current_size);
				}
				if(c!=EOF) {
					*pptr() = c;
					pbump(1);
				}
				return 0;
			}
			else {
				return basic_device::overflow(c);
			}
		}